

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_link(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uv_buf_t uVar6;
  uv_fs_t req;
  undefined1 auStack_3a0 [88];
  long lStack_348;
  long lStack_340;
  code *pcStack_1e8;
  code *pcStack_1e0;
  undefined8 local_1d8;
  char local_1c8 [88];
  char *local_170;
  
  pcVar3 = "test_file";
  pcStack_1e0 = (code *)0x15e5d0;
  unlink("test_file");
  pcStack_1e0 = (code *)0x15e5dc;
  unlink("test_file_link");
  pcStack_1e0 = (code *)0x15e5e8;
  unlink("test_file_link2");
  pcStack_1e0 = (code *)0x15e5ed;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar5 = (char *)0x0;
  pcStack_1e0 = (code *)0x15e611;
  iVar1 = uv_fs_open(0,local_1c8,"test_file",0x42,0x180,0);
  pcVar4 = local_170;
  if (iVar1 < 0) {
    pcStack_1e0 = (code *)0x15e954;
    run_test_fs_link_cold_1();
LAB_0015e954:
    pcStack_1e0 = (code *)0x15e959;
    run_test_fs_link_cold_2();
LAB_0015e959:
    pcStack_1e0 = (code *)0x15e95e;
    run_test_fs_link_cold_3();
LAB_0015e95e:
    pcStack_1e0 = (code *)0x15e963;
    run_test_fs_link_cold_4();
LAB_0015e963:
    pcStack_1e0 = (code *)0x15e968;
    run_test_fs_link_cold_5();
LAB_0015e968:
    pcStack_1e0 = (code *)0x15e96d;
    run_test_fs_link_cold_6();
LAB_0015e96d:
    pcVar4 = pcVar3;
    pcStack_1e0 = (code *)0x15e972;
    run_test_fs_link_cold_7();
LAB_0015e972:
    pcStack_1e0 = (code *)0x15e977;
    run_test_fs_link_cold_8();
LAB_0015e977:
    pcStack_1e0 = (code *)0x15e97c;
    run_test_fs_link_cold_9();
LAB_0015e97c:
    pcStack_1e0 = (code *)0x15e981;
    run_test_fs_link_cold_10();
LAB_0015e981:
    pcStack_1e0 = (code *)0x15e986;
    run_test_fs_link_cold_11();
LAB_0015e986:
    pcStack_1e0 = (code *)0x15e98b;
    run_test_fs_link_cold_12();
LAB_0015e98b:
    pcStack_1e0 = (code *)0x15e990;
    run_test_fs_link_cold_13();
LAB_0015e990:
    pcVar3 = pcVar4;
    pcStack_1e0 = (code *)0x15e995;
    run_test_fs_link_cold_14();
LAB_0015e995:
    pcStack_1e0 = (code *)0x15e99a;
    run_test_fs_link_cold_15();
LAB_0015e99a:
    pcStack_1e0 = (code *)0x15e99f;
    run_test_fs_link_cold_16();
LAB_0015e99f:
    pcStack_1e0 = (code *)0x15e9a4;
    run_test_fs_link_cold_17();
LAB_0015e9a4:
    pcStack_1e0 = (code *)0x15e9a9;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar3 = local_170;
    if ((long)local_170 < 0) goto LAB_0015e954;
    pcStack_1e0 = (code *)0x15e634;
    uv_fs_req_cleanup(local_1c8);
    pcStack_1e0 = (code *)0x15e645;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    local_1d8 = 0;
    pcVar5 = (char *)0x0;
    pcStack_1e0 = (code *)0x15e67b;
    iVar1 = uv_fs_write(0,local_1c8,(ulong)pcVar4 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar3 = pcVar4;
    if (iVar1 != 0xd) goto LAB_0015e959;
    if (local_170 != (char *)0xd) goto LAB_0015e95e;
    pcStack_1e0 = (code *)0x15e69d;
    uv_fs_req_cleanup(local_1c8);
    pcStack_1e0 = (code *)0x15e6b0;
    uv_fs_close(loop,local_1c8,(ulong)pcVar4 & 0xffffffff,0);
    pcVar5 = (char *)0x0;
    pcStack_1e0 = (code *)0x15e6cb;
    iVar1 = uv_fs_link(0,local_1c8,"test_file","test_file_link",0);
    if (iVar1 != 0) goto LAB_0015e963;
    if (local_170 != (char *)0x0) goto LAB_0015e968;
    pcStack_1e0 = (code *)0x15e6ec;
    uv_fs_req_cleanup();
    pcVar5 = (char *)0x0;
    pcStack_1e0 = (code *)0x15e708;
    iVar1 = uv_fs_open(0,local_1c8,"test_file_link",2,0,0);
    pcVar4 = local_170;
    pcVar3 = local_1c8;
    if (iVar1 < 0) goto LAB_0015e96d;
    if ((long)local_170 < 0) goto LAB_0015e972;
    pcStack_1e0 = (code *)0x15e72b;
    uv_fs_req_cleanup(local_1c8);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_1e0 = (code *)0x15e74d;
    uVar6 = (uv_buf_t)uv_buf_init(buf,0x20);
    local_1d8 = 0;
    pcVar5 = (char *)0x0;
    pcStack_1e0 = (code *)0x15e77f;
    iov = uVar6;
    iVar1 = uv_fs_read(0,local_1c8,(ulong)pcVar4 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_0015e977;
    if ((long)local_170 < 0) goto LAB_0015e97c;
    pcVar5 = buf;
    pcStack_1e0 = (code *)0x15e7a6;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_0015e981;
    pcStack_1e0 = (code *)0x15e7b5;
    close((int)pcVar4);
    pcStack_1e0 = (code *)0x15e7db;
    pcVar5 = (char *)loop;
    iVar1 = uv_fs_link(loop,local_1c8,"test_file","test_file_link2",link_cb);
    if (iVar1 != 0) goto LAB_0015e986;
    pcStack_1e0 = (code *)0x15e7f1;
    pcVar5 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_0015e98b;
    pcVar5 = (char *)0x0;
    pcStack_1e0 = (code *)0x15e81c;
    iVar1 = uv_fs_open(0,local_1c8,"test_file_link2",2,0,0);
    pcVar3 = local_170;
    if (iVar1 < 0) goto LAB_0015e990;
    if ((long)local_170 < 0) goto LAB_0015e995;
    pcStack_1e0 = (code *)0x15e83f;
    uv_fs_req_cleanup(local_1c8);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_1e0 = (code *)0x15e861;
    uVar6 = (uv_buf_t)uv_buf_init(buf,0x20);
    local_1d8 = 0;
    pcVar5 = (char *)0x0;
    pcStack_1e0 = (code *)0x15e893;
    iov = uVar6;
    iVar1 = uv_fs_read(0,local_1c8,(ulong)pcVar3 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_0015e99a;
    if ((long)local_170 < 0) goto LAB_0015e99f;
    pcVar5 = buf;
    pcStack_1e0 = (code *)0x15e8ba;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_0015e9a4;
    pcStack_1e0 = (code *)0x15e8d7;
    uv_fs_close(loop,local_1c8,(ulong)pcVar3 & 0xffffffff,0);
    pcStack_1e0 = (code *)0x15e8e5;
    uv_run(loop,0);
    pcStack_1e0 = (code *)0x15e8f1;
    unlink("test_file");
    pcStack_1e0 = (code *)0x15e8fd;
    unlink("test_file_link");
    pcStack_1e0 = (code *)0x15e909;
    unlink("test_file_link2");
    pcStack_1e0 = (code *)0x15e90e;
    pcVar3 = (char *)uv_default_loop();
    pcStack_1e0 = (code *)0x15e922;
    uv_walk(pcVar3,close_walk_cb,0);
    pcStack_1e0 = (code *)0x15e92c;
    uv_run(pcVar3,0);
    pcStack_1e0 = (code *)0x15e931;
    pcVar5 = (char *)uv_default_loop();
    pcStack_1e0 = (code *)0x15e939;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      pcStack_1e0 = (code *)0x15e942;
      uv_library_shutdown();
      return 0;
    }
  }
  pcStack_1e0 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar5)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar5)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_1e8 = (code *)0x15e9cd;
    link_cb_cold_1();
  }
  pcStack_1e8 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_1e8 = (code *)pcVar3;
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_3a0,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_0015ead0;
    if (dummy_cb_count != 1) goto LAB_0015ead5;
    if (lStack_340 != 0) goto LAB_0015eada;
    if (lStack_348 != -2) goto LAB_0015eadf;
    uv_fs_req_cleanup(auStack_3a0);
    iVar1 = uv_fs_readlink(0,auStack_3a0,"no_such_file",0);
    if (iVar1 != -2) goto LAB_0015eae4;
    if (lStack_340 != 0) goto LAB_0015eae9;
    if (lStack_348 == -2) {
      uv_fs_req_cleanup(auStack_3a0);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0015eaf3;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_0015ead0:
    run_test_fs_readlink_cold_2();
LAB_0015ead5:
    run_test_fs_readlink_cold_3();
LAB_0015eada:
    run_test_fs_readlink_cold_4();
LAB_0015eadf:
    run_test_fs_readlink_cold_5();
LAB_0015eae4:
    run_test_fs_readlink_cold_6();
LAB_0015eae9:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_0015eaf3:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_link) {
  int r;
  uv_fs_t req;
  uv_file file;
  uv_file link;

  /* Setup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  uv_fs_close(loop, &req, file, NULL);

  /* sync link */
  r = uv_fs_link(NULL, &req, "test_file", "test_file_link", NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(NULL, &req, "test_file_link", O_RDWR, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  link = req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);

  close(link);

  /* async link */
  r = uv_fs_link(loop, &req, "test_file", "test_file_link2", link_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(link_cb_count == 1);

  r = uv_fs_open(NULL, &req, "test_file_link2", O_RDWR, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  link = req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);

  uv_fs_close(loop, &req, link, NULL);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  MAKE_VALGRIND_HAPPY();
  return 0;
}